

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall Network::run(Network *this,double runtime)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running network for ",0x14);
  poVar1 = std::ostream::_M_insert<double>(runtime);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  lVar2 = std::chrono::_V2::system_clock::now();
  Clock::setDt(this->clock,this->param->dt);
  while( true ) {
    dVar4 = Clock::getCurrentTime(this->clock);
    if (runtime <= dVar4) break;
    Clock::tick(this->clock,this->param->dt);
    update(this);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Execution time: ",0x10);
  poVar1 = std::ostream::_M_insert<double>((double)((lVar3 - lVar2) / 1000) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  Logging::saveLog(this->logger);
  return;
}

Assistant:

void Network::run(double runtime) {
    cout << "Running network for " << runtime << " seconds" << endl;
    auto start = std::chrono::high_resolution_clock::now(); 
    clock->setDt(param->dt);
    while(clock->getCurrentTime() < runtime) {
        clock->tick(param->dt);
        update();
    }
    auto stop = std::chrono::high_resolution_clock::now();
    auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start); 
    cout << "Execution time: " << duration.count()/1000.0 << " milliseconds" << endl; 
    
    logger->saveLog();
}